

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O3

unique_ptr<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>_>
__thiscall
PA4Application::RenderObject::createWavefrontInstance
          (RenderObject *this,shared_ptr<Program> *program,string *objname,mat4 *modelWorld)

{
  RenderObject *this_00;
  pointer *__ptr;
  
  this_00 = (RenderObject *)operator_new(0x70);
  RenderObject(this_00,program,modelWorld);
  (this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  loadWavefront(this_00,objname);
  return (__uniq_ptr_data<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>,_true,_true>
          )(__uniq_ptr_data<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PA4Application::RenderObject> PA4Application::RenderObject::createWavefrontInstance(const std::shared_ptr<Program> & program, const std::string & objname, const glm::mat4 & modelWorld)
{
  std::unique_ptr<RenderObject> object(new RenderObject(program, modelWorld));
  object->loadWavefront(objname);
  return object;
}